

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adjointcheckpointscheme.c
# Opt level: O0

SUNErrCode
SUNAdjointCheckpointScheme_NeedsSaving
          (SUNAdjointCheckpointScheme_conflict self,suncountertype step_num,suncountertype stage_num
          ,sunrealtype t,int *yes_or_no)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  SUNErrCode err;
  SUNContext sunctx_local_scope_;
  undefined4 local_4;
  
  if (*(long *)*in_RDI == 0) {
    local_4 = -0x2701;
  }
  else {
    local_4 = (**(code **)*in_RDI)(in_XMM0_Qa,in_RDI,in_RSI,in_RDX,in_RCX);
  }
  return local_4;
}

Assistant:

SUNErrCode SUNAdjointCheckpointScheme_NeedsSaving(SUNAdjointCheckpointScheme self,
                                                  suncountertype step_num,
                                                  suncountertype stage_num,
                                                  sunrealtype t,
                                                  sunbooleantype* yes_or_no)
{
  SUNFunctionBegin(self->sunctx);
  SUNDIALS_MARK_FUNCTION_BEGIN(SUNCTX_->profiler);

  if (self->ops->needssaving)
  {
    SUNErrCode err = self->ops->needssaving(self, step_num, stage_num, t,
                                            yes_or_no);
    SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
    return err;
  }
  SUNDIALS_MARK_FUNCTION_END(SUNCTX_->profiler);
  return SUN_ERR_NOT_IMPLEMENTED;
}